

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EnsureYield(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  undefined4 uVar1;
  EmitInfo dst;
  uint32 index;
  PolymorphicEmitInfo PVar2;
  undefined1 auStack_38 [8];
  PolymorphicEmitInfo yieldEmitInfo;
  
  auStack_38 = (undefined1  [8])0x0;
  yieldEmitInfo.count = 0;
  yieldEmitInfo._4_4_ = 0;
  if ((blockInfo->yieldInfo).count != 0) {
    auStack_38 = *(undefined1 (*) [8])&blockInfo->yieldInfo;
    yieldEmitInfo._0_8_ = (blockInfo->yieldInfo).field_1;
    if (blockInfo->didYield == false) {
      blockInfo->didYield = true;
      uVar1 = auStack_38._0_4_;
      if (auStack_38._0_4_ != 0) {
        index = 0;
        do {
          dst = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)auStack_38,index);
          EmitLoadConst(this,dst,(WasmConstLitNode)ZEXT816(0));
          index = index + 1;
        } while (uVar1 != index);
      }
    }
  }
  PVar2._0_8_ = (ulong)auStack_38 & 0xffffffff;
  PVar2.field_1 = (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)yieldEmitInfo._0_8_;
  return PVar2;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EnsureYield(BlockInfo* blockInfo)
{
    PolymorphicEmitInfo yieldEmitInfo;
    if (blockInfo->HasYield())
    {
        yieldEmitInfo = blockInfo->yieldInfo;
        if (!blockInfo->DidYield())
        {
            // Emit a load to the yield location to make sure we have a dest there
            // Most likely we can't reach this code so the value doesn't matter
            blockInfo->didYield = true;
            for (uint32 i = 0; i < yieldEmitInfo.Count(); ++i)
            {
                EmitLoadConst(yieldEmitInfo.GetInfo(i), GetZeroCnst());
            }
        }
    }
    return yieldEmitInfo;
}